

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::
validateNeuralNetwork<CoreML::Specification::NeuralNetworkRegressor>
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,
          NeuralNetworkRegressor *nn)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_01;
  void **ppvVar1;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar2;
  uint32_t uVar3;
  Rep *pRVar4;
  NeuralNetworkLayer *layer;
  Tensor *pTVar5;
  key_type *pkVar6;
  NeuralNetworkSpecValidator *pNVar7;
  bool bVar8;
  Type *pTVar9;
  iterator iVar10;
  uint32_t *puVar11;
  iterator iVar12;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this_02;
  mapped_type *pmVar13;
  void **ppvVar14;
  void **ppvVar15;
  long lVar16;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *this_03;
  int iVar17;
  long lVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string err_7;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  NeuralNetworkSpecValidator *local_f0;
  _Base_ptr local_e8;
  _Base_ptr local_e0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *local_d8;
  _Base_ptr local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  Result r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Result::Result(&r);
  pRVar4 = (nn->layers_).super_RepeatedPtrFieldBase.rep_;
  ppvVar14 = pRVar4->elements;
  if (pRVar4 == (Rep *)0x0) {
    ppvVar14 = (void **)0x0;
  }
  ppvVar1 = ppvVar14 + (nn->layers_).super_RepeatedPtrFieldBase.current_size_;
  this_00 = &this->ModelIOBlobNameToRank;
  local_e0 = &(this->ModelIOBlobNameToRank)._M_t._M_impl.super__Rb_tree_header._M_header;
  this_01 = &this->blobNameToRank;
  local_e8 = &(this->blobNameToRank)._M_t._M_impl.super__Rb_tree_header._M_header;
  this_03 = &this->blobs;
  local_d0 = &(this->blobs)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_f0 = this;
  local_d8 = this_03;
  do {
    pNVar7 = local_f0;
    if (ppvVar14 == ppvVar1) {
      Result::Result(__return_storage_ptr__);
LAB_0027ba4f:
      std::__cxx11::string::~string((string *)&r.m_message);
      return __return_storage_ptr__;
    }
    layer = (NeuralNetworkLayer *)*ppvVar14;
    bVar8 = Result::good(&r);
    if (!bVar8) {
LAB_0027b4f7:
      Result::Result(__return_storage_ptr__,&r);
      goto LAB_0027ba4f;
    }
    if (pNVar7->ndArrayInterpretation == true) {
      iVar17 = (layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_;
      if ((long)iVar17 != 0) {
        if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ == iVar17) {
          pRVar4 = (layer->inputtensor_).super_RepeatedPtrFieldBase.rep_;
          ppvVar15 = pRVar4->elements;
          if (pRVar4 == (Rep *)0x0) {
            ppvVar15 = (void **)0x0;
          }
          pRVar2 = &layer->input_;
          lVar18 = 0;
          for (lVar16 = (long)iVar17 << 3; lVar16 != 0; lVar16 = lVar16 + -8) {
            pTVar5 = (Tensor *)ppvVar15[lVar18];
            validateTensorMessage((Result *)&err,pTVar5,layer);
            Result::operator=(&r,(Result *)&err);
            std::__cxx11::string::~string((string *)&err._M_string_length);
            bVar8 = Result::good(&r);
            this_03 = local_d8;
            if (!bVar8) goto LAB_0027b4f7;
            iVar17 = (int)lVar18;
            pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                               (&pRVar2->super_RepeatedPtrFieldBase,iVar17);
            iVar10 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::find(&this_00->_M_t,pTVar9);
            if (iVar10._M_node != local_e0) {
              uVar3 = pTVar5->rank_;
              pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
                       Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                 (&pRVar2->super_RepeatedPtrFieldBase,iVar17);
              puVar11 = (uint32_t *)
                        std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        ::operator[](this_00,pTVar9);
              if (uVar3 != *puVar11) {
                std::__cxx11::string::string
                          ((string *)&local_150,
                           (string *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
                std::operator+(&local_130,"Layer \'",&local_150);
                std::operator+(&local_110,&local_130,"\'\'s input \'");
                pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
                         Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                   (&pRVar2->super_RepeatedPtrFieldBase,iVar17);
                std::__cxx11::string::string((string *)&local_c8,(string *)pTVar9);
                std::operator+(&local_1d8,&local_110,&local_c8);
                std::operator+(&err_7,&local_1d8,
                               "\' is also an input to the model. However, for this tensor the rank provided in the layer description"
                              );
                std::operator+(&err,&err_7,
                               " does not match the one provided in the model description");
                std::__cxx11::string::~string((string *)&err_7);
                std::__cxx11::string::~string((string *)&local_1d8);
                std::__cxx11::string::~string((string *)&local_c8);
                std::__cxx11::string::~string((string *)&local_110);
                std::__cxx11::string::~string((string *)&local_130);
                std::__cxx11::string::~string((string *)&local_150);
                Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
                goto LAB_0027ba45;
              }
            }
            pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                               (&pRVar2->super_RepeatedPtrFieldBase,iVar17);
            iVar10 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::find(&this_01->_M_t,pTVar9);
            if (iVar10._M_node == local_e8) {
              uVar3 = pTVar5->rank_;
              pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
                       Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                 (&pRVar2->super_RepeatedPtrFieldBase,iVar17);
              puVar11 = (uint32_t *)
                        std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        ::operator[](this_01,pTVar9);
              *puVar11 = uVar3;
            }
            else {
              pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
                       Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                 (&pRVar2->super_RepeatedPtrFieldBase,iVar17);
              puVar11 = (uint32_t *)
                        std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        ::operator[](this_01,pTVar9);
              if (*puVar11 != pTVar5->rank_) {
                pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
                         Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                   (&pRVar2->super_RepeatedPtrFieldBase,iVar17);
                std::__cxx11::string::string((string *)&local_1d8,(string *)pTVar9);
                std::operator+(&err_7,"Inconsistent rank for the blob named \'",&local_1d8);
                std::operator+(&err,&err_7,"\'.");
                std::__cxx11::string::~string((string *)&err_7);
                std::__cxx11::string::~string((string *)&local_1d8);
                Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
                goto LAB_0027ba45;
              }
            }
            lVar18 = lVar18 + 1;
          }
          goto LAB_0027b19a;
        }
        std::__cxx11::string::string
                  ((string *)&local_1d8,
                   (string *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        std::operator+(&err_7,"Layer \'",&local_1d8);
        std::operator+(&err,&err_7,"\'\'s input and inputTensors have different lengths");
        std::__cxx11::string::~string((string *)&err_7);
        std::__cxx11::string::~string((string *)&local_1d8);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
LAB_0027ba45:
        std::__cxx11::string::~string((string *)&err);
        goto LAB_0027ba4f;
      }
LAB_0027b19a:
      iVar17 = (layer->outputtensor_).super_RepeatedPtrFieldBase.current_size_;
      if ((long)iVar17 != 0) {
        if ((layer->output_).super_RepeatedPtrFieldBase.current_size_ != iVar17) {
          std::__cxx11::string::string
                    ((string *)&local_1d8,
                     (string *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
          std::operator+(&err_7,"Layer \'",&local_1d8);
          std::operator+(&err,&err_7,
                         "\'\'s output and \"outputTensors\" property have different lengths");
          std::__cxx11::string::~string((string *)&err_7);
          std::__cxx11::string::~string((string *)&local_1d8);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
          goto LAB_0027ba45;
        }
        pRVar4 = (layer->outputtensor_).super_RepeatedPtrFieldBase.rep_;
        ppvVar15 = pRVar4->elements;
        if (pRVar4 == (Rep *)0x0) {
          ppvVar15 = (void **)0x0;
        }
        pRVar2 = &layer->output_;
        lVar18 = 0;
        for (lVar16 = (long)iVar17 << 3; lVar16 != 0; lVar16 = lVar16 + -8) {
          pTVar5 = (Tensor *)ppvVar15[lVar18];
          validateTensorMessage((Result *)&err,pTVar5,layer);
          Result::operator=(&r,(Result *)&err);
          std::__cxx11::string::~string((string *)&err._M_string_length);
          bVar8 = Result::good(&r);
          this_03 = local_d8;
          if (!bVar8) goto LAB_0027b4f7;
          iVar17 = (int)lVar18;
          pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (&pRVar2->super_RepeatedPtrFieldBase,iVar17);
          iVar10 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::find(&this_00->_M_t,pTVar9);
          if (iVar10._M_node != local_e0) {
            uVar3 = pTVar5->rank_;
            pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                               (&pRVar2->super_RepeatedPtrFieldBase,iVar17);
            puVar11 = (uint32_t *)
                      std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::operator[](this_00,pTVar9);
            if (uVar3 != *puVar11) {
              std::__cxx11::string::string
                        ((string *)&local_150,
                         (string *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
              std::operator+(&local_130,"Layer \'",&local_150);
              std::operator+(&local_110,&local_130,"\'\'s output \'");
              pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
                       Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                 (&pRVar2->super_RepeatedPtrFieldBase,iVar17);
              std::__cxx11::string::string((string *)&local_c8,(string *)pTVar9);
              std::operator+(&local_1d8,&local_110,&local_c8);
              std::operator+(&err_7,&local_1d8,
                             "\' is also an output of the model. However, for this tensor the rank provided in the layer description"
                            );
              std::operator+(&err,&err_7," does not match the one provided in the model description"
                            );
              std::__cxx11::string::~string((string *)&err_7);
              std::__cxx11::string::~string((string *)&local_1d8);
              std::__cxx11::string::~string((string *)&local_c8);
              std::__cxx11::string::~string((string *)&local_110);
              std::__cxx11::string::~string((string *)&local_130);
              std::__cxx11::string::~string((string *)&local_150);
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
              goto LAB_0027ba45;
            }
          }
          pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (&pRVar2->super_RepeatedPtrFieldBase,iVar17);
          iVar10 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::find(&this_01->_M_t,pTVar9);
          if (iVar10._M_node == local_e8) {
            uVar3 = pTVar5->rank_;
            pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                               (&pRVar2->super_RepeatedPtrFieldBase,iVar17);
            puVar11 = (uint32_t *)
                      std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::operator[](this_01,pTVar9);
            *puVar11 = uVar3;
          }
          else {
            pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                               (&pRVar2->super_RepeatedPtrFieldBase,iVar17);
            puVar11 = (uint32_t *)
                      std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::operator[](this_01,pTVar9);
            if (*puVar11 != pTVar5->rank_) {
              pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
                       Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                 (&pRVar2->super_RepeatedPtrFieldBase,iVar17);
              std::__cxx11::string::string((string *)&local_1d8,(string *)pTVar9);
              std::operator+(&err_7,"Inconsistent rank for the blob named \'",&local_1d8);
              std::operator+(&err,&err_7,"\'.");
              std::__cxx11::string::~string((string *)&err_7);
              std::__cxx11::string::~string((string *)&local_1d8);
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
              goto LAB_0027ba45;
            }
          }
          lVar18 = lVar18 + 1;
        }
      }
    }
    validateLayer((Result *)&err,local_f0,layer);
    Result::operator=(&r,(Result *)&err);
    std::__cxx11::string::~string((string *)&err._M_string_length);
    bVar8 = Result::good(&r);
    if (!bVar8) goto LAB_0027b4f7;
    pRVar4 = (layer->input_).super_RepeatedPtrFieldBase.rep_;
    ppvVar15 = pRVar4->elements;
    if (pRVar4 == (Rep *)0x0) {
      ppvVar15 = (void **)0x0;
    }
    iVar17 = (layer->input_).super_RepeatedPtrFieldBase.current_size_;
    lVar16 = 0;
    while ((long)iVar17 * 8 != lVar16) {
      pkVar6 = *(key_type **)((long)ppvVar15 + lVar16);
      iVar12 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ::find(&this_03->_M_t,pkVar6);
      lVar16 = lVar16 + 8;
      if (iVar12._M_node == local_d0) {
        std::__cxx11::string::string
                  ((string *)&local_130,
                   (string *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        std::operator+(&local_110,"Layer \'",&local_130);
        std::operator+(&local_1d8,&local_110,"\' consumes an input named \'");
        std::__cxx11::string::string((string *)&local_150,(string *)pkVar6);
        std::operator+(&err_7,&local_1d8,&local_150);
        std::operator+(&err,&err_7,"\' which is not present in this network.");
        std::__cxx11::string::~string((string *)&err_7);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_1d8);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_130);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
        goto LAB_0027ba45;
      }
    }
    pRVar4 = (layer->output_).super_RepeatedPtrFieldBase.rep_;
    ppvVar15 = pRVar4->elements;
    if (pRVar4 == (Rep *)0x0) {
      ppvVar15 = (void **)0x0;
    }
    iVar17 = (layer->output_).super_RepeatedPtrFieldBase.current_size_;
    for (lVar16 = 0; (long)iVar17 * 8 != lVar16; lVar16 = lVar16 + 8) {
      pkVar6 = *(key_type **)((long)ppvVar15 + lVar16);
      iVar12 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ::find(&this_03->_M_t,pkVar6);
      if ((iVar12._M_node != local_d0) && (layer->_oneof_case_[0] != 600)) {
        pmVar13 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ::operator[](this_03,pkVar6);
        std::__cxx11::string::string
                  ((string *)&err,
                   (string *)((pmVar13->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left + 1));
        std::__cxx11::string::string
                  ((string *)&local_50,
                   (string *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        std::operator+(&local_c8,"Layer \'",&local_50);
        std::operator+(&local_150,&local_c8,"\' produces an output named \'");
        std::__cxx11::string::string((string *)&local_70,(string *)pkVar6);
        std::operator+(&local_130,&local_150,&local_70);
        std::operator+(&local_110,&local_130,"\' which is also an output produced by the layer \'");
        std::operator+(&local_1d8,&local_110,&err);
        std::operator+(&err_7,&local_1d8,"\'.");
        std::__cxx11::string::~string((string *)&local_1d8);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_50);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err_7);
        std::__cxx11::string::~string((string *)&err_7);
        goto LAB_0027ba45;
      }
      this_02 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 *)std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   ::operator[](this_03,pkVar6);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                (this_02,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    }
    ppvVar14 = ppvVar14 + 1;
  } while( true );
}

Assistant:

Result NeuralNetworkSpecValidator::validateNeuralNetwork(const T& nn) {

    Result r;

    // Loop over the layers
    // For each layer, validate the following:
    // 1. inputtensor/outputtensor message, rank compatibilty with Model input/output ranks
    // 2. Check rank consistency across the network for all blobs: ranks are not allowed to change for the same blob
    // 3. Call layer specific validation function
    // 4. check that layer's inputs are already present in "availableBlobs" set
    // 5. check that layer's outputs are NOT already present in "availableBlobs" set
    // 6. Add the layer's outputs to the "availableBlobs" set
    for (const auto& layer : nn.layers()) {

        if (!r.good()) {
            return r;
        }

        // check for inputtensor message validity
        if (ndArrayInterpretation) {
            if (layer.inputtensor_size() != 0) {
                if (layer.input_size() != layer.inputtensor_size()) {
                    std::string err = "Layer '" + std::string(layer.name()) + "''s input and inputTensors have different lengths";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
                int idx = 0;
                for (const auto& tensor: layer.inputtensor()) {
                    r = validateTensorMessage(tensor, layer);
                    if (!r.good()) {
                        return r;
                    }
                    if (!(ModelIOBlobNameToRank.find(layer.input(idx)) == ModelIOBlobNameToRank.end())) {
                        if (static_cast<int>(tensor.rank()) != ModelIOBlobNameToRank[layer.input(idx)]) {
                            std::string err = "Layer '" + std::string(layer.name()) + "''s input '" + std::string(layer.input(idx)) + \
                            "' is also an input to the model. However, for this tensor the rank provided in the layer description" + \
                            " does not match the one provided in the model description";
                            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                        }
                    }
                    // verify rank consistency of intermediate blobs:
                    // if a blob is both an input and output to layers, the rank specified at both places must match
                    if (blobNameToRank.find(layer.input(idx)) == blobNameToRank.end()) {
                        blobNameToRank[layer.input(idx)] = (int)tensor.rank();
                    } else {
                        if (blobNameToRank[layer.input(idx)] != (int)tensor.rank()) {
                            std::string err = "Inconsistent rank for the blob named '" + std::string(layer.input(idx)) + "'.";
                            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                        }
                    }
                    idx++;
                }
            }
            if (layer.outputtensor_size() != 0) {
                if (layer.output_size() != layer.outputtensor_size()) {
                    std::string err = "Layer '" + std::string(layer.name()) + "''s output and \"outputTensors\" property have different lengths";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
                int idx = 0;
                for (const auto& tensor: layer.outputtensor()) {
                    r = validateTensorMessage(tensor, layer);
                    if (!r.good()) {
                        return r;
                    }
                    if (!(ModelIOBlobNameToRank.find(layer.output(idx)) == ModelIOBlobNameToRank.end())) {
                        if (static_cast<int>(tensor.rank()) != ModelIOBlobNameToRank[layer.output(idx)]) {
                            std::string err = "Layer '" + std::string(layer.name()) + "''s output '" + std::string(layer.output(idx)) + \
                            "' is also an output of the model. However, for this tensor the rank provided in the layer description" + \
                            " does not match the one provided in the model description";
                            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                        }
                    }
                    // verify rank consistency of intermediate blobs:
                    // if a blob is both an input and output to layers, the rank specified at both places must match
                    if (blobNameToRank.find(layer.output(idx)) == blobNameToRank.end()) {
                        blobNameToRank[layer.output(idx)] = (int)tensor.rank();
                    } else {
                        if (blobNameToRank[layer.output(idx)] != (int)tensor.rank()) {
                            std::string err = "Inconsistent rank for the blob named '" + std::string(layer.output(idx)) + "'.";
                            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                        }
                    }
                    idx++;
                }
            }
        } // inputtensor, outputtensor validity end

        // First, we check the layer for internal correctness
        // this calls layer wise function
        r = validateLayer(layer);

        if (!r.good()) {
            return r;
        }

        // Check for topological defects: the layer's input must have been produced by a blob we have
        // already seen.
        for (const auto& input: layer.input()) {
            if (blobs.find(input) == blobs.end()) {
                std::string err = "Layer '" + std::string(layer.name()) + "' consumes an input named '"
                + std::string(input) + "' which is not present in this network.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            }
        }

        // Check for topological defects: check that the same output isn't being produced in two different places.
        // unless its the "copy" layer
        for (const auto& output: layer.output()) {
            if (blobs.find(output) != blobs.end()) {
                if (layer.layer_case() != Specification::NeuralNetworkLayer::LayerCase::kCopy) {
                    std::string layer_name = *(blobs[output].begin());
                    std::string err = "Layer '" + std::string(layer.name()) + "' produces an output named '"
                    + std::string(output) + "' which is also an output produced by the layer '"
                    + layer_name + "'.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }
            blobs[output].insert(layer.name());
        }
    } // loop over layers

    return Result();
}